

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O2

int point_mul_g_id_tc26_gost_3410_2012_256_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,BN_CTX *ctx)

{
  char cVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  pt_aff_t_conflict1 (*papVar5) [16];
  int iVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  pt_aff_t_conflict1 *arg3;
  bool bVar11;
  pt_aff_t_conflict1 local_2c8;
  uchar b_n [32];
  uint64_t local_228;
  long lStack_220;
  long local_218;
  long lStack_210;
  long local_208;
  uint64_t local_200 [5];
  uint64_t local_1d8;
  long lStack_1d0;
  long local_1c8;
  long lStack_1c0;
  long local_1b8;
  uchar b_x [32];
  uint64_t local_180 [5];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  uint64_t local_138;
  uint64_t local_130 [5];
  uchar b_y [32];
  uint64_t local_e0 [5];
  uint64_t local_b8 [5];
  uint64_t local_90 [5];
  int8_t rnaf [52];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar3 = BN_CTX_get((BN_CTX *)ctx);
  pBVar4 = BN_CTX_get((BN_CTX *)ctx);
  iVar6 = 0;
  if ((pBVar4 != (BIGNUM *)0x0) && (iVar2 = BN_bn2lebinpad(n,b_n,0x20), iVar2 == 0x20)) {
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    memset(b_y,0,0xa0);
    local_2c8.T[2] = 0;
    local_2c8.T[3] = 0;
    local_2c8.T[0] = 0;
    local_2c8.T[1] = 0;
    local_2c8.Y[3] = 0;
    local_2c8.Y[4] = 0;
    local_2c8.Y[1] = 0;
    local_2c8.Y[2] = 0;
    local_2c8.X[4] = 0;
    local_2c8.Y[0] = 0;
    local_2c8.X[2] = 0;
    local_2c8.X[3] = 0;
    local_2c8.X[0] = 0;
    local_2c8.X[1] = 0;
    local_2c8.T[4] = 0;
    scalar_rwnaf(rnaf,b_n);
    b_x[0x10] = '\0';
    b_x[0x11] = '\0';
    b_x[0x12] = '\0';
    b_x[0x13] = '\0';
    b_x[0x14] = '\0';
    b_x[0x15] = '\0';
    b_x[0x16] = '\0';
    b_x[0x17] = '\0';
    b_x[0x18] = '\0';
    b_x[0x19] = '\0';
    b_x[0x1a] = '\0';
    b_x[0x1b] = '\0';
    b_x[0x1c] = '\0';
    b_x[0x1d] = '\0';
    b_x[0x1e] = '\0';
    b_x[0x1f] = '\0';
    b_x[0] = '\0';
    b_x[1] = '\0';
    b_x[2] = '\0';
    b_x[3] = '\0';
    b_x[4] = '\0';
    b_x[5] = '\0';
    b_x[6] = '\0';
    b_x[7] = '\0';
    b_x[8] = '\0';
    b_x[9] = '\0';
    b_x[10] = '\0';
    b_x[0xb] = '\0';
    b_x[0xc] = '\0';
    b_x[0xd] = '\0';
    b_x[0xe] = '\0';
    b_x[0xf] = '\0';
    local_180[0] = 1;
    local_180[1] = 0;
    local_180[4] = 0;
    local_180[2] = 0;
    local_180[3] = 0;
    local_158 = (undefined1  [16])0x0;
    local_148 = (undefined1  [16])0x0;
    local_138 = 0;
    local_130[4] = 0;
    local_130[0] = 1;
    local_130[1] = 0;
    local_130[2] = 0;
    local_130[3] = 0;
    for (uVar8 = 3; -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      if (uVar8 != 3) {
        iVar6 = 5;
        while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
          point_double((pt_prj_t_conflict1 *)b_x,(pt_prj_t_conflict1 *)b_x);
        }
      }
      papVar5 = lut_cmb;
      for (lVar9 = 0; lVar9 != 0xe; lVar9 = lVar9 + 1) {
        lVar10 = (ulong)uVar8 + lVar9 * 4;
        if ((int)lVar10 < 0x34) {
          cVar1 = rnaf[lVar10];
          lVar10 = 0;
          arg3 = *papVar5;
          for (; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            bVar11 = (int)((int)(char)(-1 - (cVar1 >> 7)) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                          (uint)lVar10) < 1;
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      (local_2c8.X,bVar11,local_2c8.X,arg3->X);
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      (local_2c8.Y,bVar11,local_2c8.Y,arg3->Y);
            fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                      (local_2c8.T,bVar11,local_2c8.T,arg3->T);
            arg3 = arg3 + 1;
          }
          local_208 = 0xffffffffffffe - local_2c8.X[4];
          local_228 = 0x1ffffffffffb2e - local_2c8.X[0];
          lStack_220 = 0xffffffffffffe - local_2c8.X[1];
          local_218 = 0xffffffffffffe - local_2c8.X[2];
          lStack_210 = 0xffffffffffffe - local_2c8.X[3];
          local_1b8 = 0xffffffffffffe - local_2c8.T[4];
          local_1d8 = 0x1ffffffffffb2e - local_2c8.T[0];
          lStack_1d0 = 0xffffffffffffe - local_2c8.T[1];
          local_1c8 = 0xffffffffffffe - local_2c8.T[2];
          lStack_1c0 = 0xffffffffffffe - local_2c8.T[3];
          bVar7 = (byte)(cVar1 >> 7) >> 7;
          fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                    (local_2c8.X,bVar7,local_2c8.X,&local_228);
          fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                    (local_2c8.T,bVar7,local_2c8.T,&local_1d8);
          point_add_mixed((pt_prj_t_conflict1 *)b_x,(pt_prj_t_conflict1 *)b_x,&local_2c8);
        }
        papVar5 = (pt_aff_t_conflict1 (*) [16])((long)papVar5 + 0x780);
      }
    }
    fiat_id_tc26_gost_3410_2012_256_paramSetA_opp(local_2c8.X,(uint64_t *)lut_cmb);
    local_2c8.Y[4] = 0x30650f195523a;
    local_2c8.Y[2] = 0x60ec939cfdf1b;
    local_2c8.Y[3] = 0x6cd212230e3ea;
    local_2c8.Y[0] = 0xb2592dba300e7;
    local_2c8.Y[1] = 0x3e87f22e81f92;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_opp(local_2c8.T,lut_cmb[0][0].T);
    point_add_mixed((pt_prj_t_conflict1 *)b_y,(pt_prj_t_conflict1 *)b_x,&local_2c8);
    bVar7 = b_n[0] & 1;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
              ((uint64_t *)b_x,bVar7,(uint64_t *)b_y,(uint64_t *)b_x);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_180,bVar7,local_e0,local_180);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
              ((uint64_t *)local_158,bVar7,local_b8,(uint64_t *)local_158);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_130,bVar7,local_90,local_130);
    point_edwards2legacy((pt_prj_t_conflict1 *)b_x,(pt_prj_t_conflict1 *)b_x);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_inv(local_130,local_130);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(&local_228,(uint64_t *)b_x,local_130);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_200,local_180,local_130);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(b_x,&local_228);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(b_y,local_200);
    iVar6 = CRYPTO_memcmp("",b_x,0x20);
    if ((iVar6 == 0) && (iVar6 = CRYPTO_memcmp("",b_y,0x20), iVar6 == 0)) {
      iVar6 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar6 == 0) {
        iVar6 = 0;
        goto LAB_0012af7d;
      }
    }
    else {
      lVar9 = BN_lebin2bn(b_x,0x20,pBVar3);
      iVar6 = 0;
      if ((lVar9 == 0) ||
         ((lVar9 = BN_lebin2bn(b_y,0x20,pBVar4), lVar9 == 0 ||
          (iVar2 = EC_POINT_set_affine_coordinates(group,r,pBVar3,pBVar4,ctx), iVar2 == 0))))
      goto LAB_0012af7d;
    }
    iVar6 = 1;
  }
LAB_0012af7d:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar6;
}

Assistant:

int
    point_mul_g_id_tc26_gost_3410_2012_256_paramSetA(const EC_GROUP *group,
                                                     EC_POINT *r,
                                                     const BIGNUM *n,
                                                     BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_n[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL || BN_bn2lebinpad(n, b_n, 32) != 32)
        goto err;
    /* do the fixed scalar multiplication */
    point_mul_g(b_x, b_y, b_n);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}